

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void file_opendir_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &opendir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xdf,"req == &opendir_req");
    abort();
  }
  if (opendir_req.fs_type != UV_FS_OPENDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xe0,"req->fs_type == UV_FS_OPENDIR");
    abort();
  }
  if (opendir_req.result != -0x14) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xe1,"req->result == UV_ENOTDIR");
    abort();
  }
  if (opendir_req.ptr != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0xe2,"req->ptr == NULL");
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  file_opendir_cb_count = file_opendir_cb_count + 1;
  return;
}

Assistant:

static void file_opendir_cb(uv_fs_t* req) {
  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == UV_ENOTDIR);
  ASSERT(req->ptr == NULL);

  uv_fs_req_cleanup(req);
  ++file_opendir_cb_count;
}